

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Encoder.cpp
# Opt level: O0

shared_ptr<Storage::Disk::Track> __thiscall
Storage::Encodings::MFM::TrackWithSectors
          (MFM *this,Density density,
          vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
          *sectors,optional<unsigned_long> sector_gap_length,
          optional<unsigned_char> sector_gap_filler_byte)

{
  optional<unsigned_char> sector_gap_filler_byte_00;
  optional<unsigned_char> sector_gap_filler_byte_01;
  optional<unsigned_char> sector_gap_filler_byte_02;
  _Storage<unsigned_long,_true> _Var1;
  shared_ptr<Storage::Disk::Track> sVar3;
  optional<unsigned_long> sector_gap_length_00;
  optional<unsigned_long> sector_gap_length_01;
  optional<unsigned_long> sector_gap_length_02;
  vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
  *sectors_local;
  Density density_local;
  optional<unsigned_char> sector_gap_filler_byte_local;
  optional<unsigned_long> sector_gap_length_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  _Var1._M_value =
       sector_gap_length.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  sector_gap_filler_byte_00.super__Optional_base<unsigned_char,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_char>._M_payload =
       sector_gap_length.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  if (density != Single) {
    if (density == Double) {
      sector_gap_length_01.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ = _Var1._M_value;
      sector_gap_length_01.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload =
           (_Storage<unsigned_long,_true>)sectors;
      sector_gap_filler_byte_01.super__Optional_base<unsigned_char,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_char>._M_engaged = false;
      sector_gap_filler_byte_01.super__Optional_base<unsigned_char,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_char>._M_payload._M_value =
           sector_gap_filler_byte_00.super__Optional_base<unsigned_char,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_char>._M_payload;
      sVar3 = anon_unknown.dwarf_fae042::TTrackWithSectors<(Storage::Encodings::MFM::Density)1>
                        ((vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
                          *)this,sector_gap_length_01,sector_gap_filler_byte_01);
      _Var2 = sVar3.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
      goto LAB_00988b23;
    }
    if (density == High) {
      sector_gap_length_02.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._8_8_ = _Var1._M_value;
      sector_gap_length_02.super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_payload =
           (_Storage<unsigned_long,_true>)sectors;
      sector_gap_filler_byte_02.super__Optional_base<unsigned_char,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_char>._M_engaged = false;
      sector_gap_filler_byte_02.super__Optional_base<unsigned_char,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_char>._M_payload._M_value =
           sector_gap_filler_byte_00.super__Optional_base<unsigned_char,_true,_true>._M_payload.
           super__Optional_payload_base<unsigned_char>._M_payload;
      sVar3 = anon_unknown.dwarf_fae042::TTrackWithSectors<(Storage::Encodings::MFM::Density)2>
                        ((vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
                          *)this,sector_gap_length_02,sector_gap_filler_byte_02);
      _Var2 = sVar3.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              ._M_pi;
      goto LAB_00988b23;
    }
  }
  sector_gap_length_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._8_8_ = _Var1._M_value;
  sector_gap_length_00.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload = (_Storage<unsigned_long,_true>)sectors;
  sector_gap_filler_byte_00.super__Optional_base<unsigned_char,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_char>._M_engaged = false;
  sVar3 = anon_unknown.dwarf_fae042::TTrackWithSectors<(Storage::Encodings::MFM::Density)0>
                    ((vector<const_Storage::Encodings::MFM::Sector_*,_std::allocator<const_Storage::Encodings::MFM::Sector_*>_>
                      *)this,sector_gap_length_00,sector_gap_filler_byte_00);
  _Var2 = sVar3.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi;
LAB_00988b23:
  sVar3.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<Storage::Disk::Track>)
         sVar3.super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Storage::Disk::Track> Storage::Encodings::MFM::TrackWithSectors(
	Density density,
	const std::vector<const Sector *> &sectors,
	std::optional<std::size_t> sector_gap_length,
	std::optional<uint8_t> sector_gap_filler_byte
) {
	switch(density) {
		default:
		case Density::Single:	return TTrackWithSectors<Density::Single>(sectors, sector_gap_length, sector_gap_filler_byte);
		case Density::Double:	return TTrackWithSectors<Density::Double>(sectors, sector_gap_length, sector_gap_filler_byte);
		case Density::High:		return TTrackWithSectors<Density::High>(sectors, sector_gap_length, sector_gap_filler_byte);
	}
}